

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O1

wchar_t archive_read_format_lha_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  lzh_br *br;
  long *plVar1;
  lzh_stream *strm;
  long lVar2;
  char cVar3;
  ushort uVar4;
  int iVar5;
  int64_t *piVar6;
  int *piVar7;
  lzh_dec *ds;
  htree_t *phVar8;
  undefined4 *puVar9;
  uint64_t uVar10;
  long lVar11;
  uint16_t uVar12;
  uint uVar13;
  wchar_t wVar14;
  int iVar15;
  wchar_t wVar16;
  void *pvVar17;
  ulong uVar18;
  wchar_t wVar19;
  uint uVar20;
  int iVar21;
  wchar_t tbl_bits;
  wchar_t tbl_bits_00;
  wchar_t *pwVar22;
  char *fmt;
  size_t len;
  byte bVar23;
  long *plVar24;
  wchar_t wVar25;
  htree_t *phVar26;
  wchar_t wVar27;
  wchar_t wVar28;
  huffman_conflict *hf;
  long lVar29;
  byte bVar30;
  huffman_conflict *phVar31;
  lzh_br local_d8;
  long local_c0;
  wchar_t local_b4;
  wchar_t *local_b0;
  archive_read *local_a8;
  long *local_a0;
  wchar_t local_94;
  huffman_conflict *local_90;
  huffman_conflict *local_88;
  void **local_80;
  long local_78;
  wchar_t *local_70;
  uchar *local_68;
  lzh_br *local_60;
  uchar *local_58;
  long local_50;
  long local_48;
  long *local_40;
  size_t *local_38;
  
  piVar6 = (int64_t *)a->format->data;
  if (piVar6[2] != 0) {
    __archive_read_consume(a,piVar6[2]);
    piVar6[2] = 0;
  }
  if (*(char *)((long)piVar6 + 0x124) != '\0') {
    if (*(char *)((long)piVar6 + 0x125) == '\0') {
      if (((*(byte *)(piVar6 + 8) & 8) != 0) &&
         (*(short *)((long)piVar6 + 0xc2) != (short)piVar6[3])) {
        archive_set_error(&a->archive,-1,"LHa data CRC error");
        return L'\xffffffec';
      }
      *(undefined1 *)((long)piVar6 + 0x125) = 1;
    }
    *offset = *piVar6;
    *size = 0;
    *buff = (void *)0x0;
    return L'\x01';
  }
  plVar24 = (long *)a->format->data;
  local_80 = buff;
  if (*(char *)((long)piVar6 + 0x126) == '\0') {
    if (plVar24[1] == 0) {
      *buff = (void *)0x0;
      *size = 0;
      *offset = *plVar24;
      *(undefined1 *)((long)plVar24 + 0x124) = 1;
      return L'\0';
    }
    pvVar17 = __archive_read_ahead(a,1,(ssize_t *)&local_d8);
    *local_80 = pvVar17;
    if (0 < (long)local_d8.cache_buffer) {
      if (plVar24[1] < (long)local_d8.cache_buffer) {
        local_d8.cache_buffer = plVar24[1];
      }
      uVar10 = local_d8.cache_buffer;
      uVar12 = lha_crc16(*(uint16_t *)(plVar24 + 3),pvVar17,local_d8.cache_buffer);
      *(uint16_t *)(plVar24 + 3) = uVar12;
      *size = uVar10;
      *offset = *plVar24;
      *plVar24 = *plVar24 + uVar10;
      plVar1 = plVar24 + 1;
      *plVar1 = *plVar1 - local_d8.cache_buffer;
      if (*plVar1 == 0) {
        *(undefined1 *)((long)plVar24 + 0x124) = 1;
      }
      plVar24[2] = local_d8.cache_buffer;
      return L'\0';
    }
    fmt = "Truncated LHa file data";
  }
  else {
    if (plVar24[0x25] == 0) {
      plVar24[0x26] = 0x10000;
      pvVar17 = malloc(0x10000);
      plVar24[0x25] = (long)pvVar17;
      if (pvVar17 != (void *)0x0) goto LAB_0012b197;
      fmt = "No memory for lzh decompression";
LAB_0012c486:
      iVar15 = 0xc;
      goto LAB_0012c48e;
    }
LAB_0012b197:
    if (*(char *)((long)plVar24 + 0x123) == '\0') {
      if (plVar24[0x35] == 0) {
        pvVar17 = calloc(1,0x158);
        plVar24[0x35] = (long)pvVar17;
        if (pvVar17 != (void *)0x0) goto LAB_0012c12d;
        iVar15 = -0x1e;
      }
      else {
LAB_0012c12d:
        puVar9 = (undefined4 *)plVar24[0x35];
        puVar9[0x55] = 0xffffffe7;
        iVar15 = -0x19;
        if ((*(char *)((long)plVar24 + 0x29) == 'l') && (*(char *)((long)plVar24 + 0x2a) == 'h')) {
          cVar3 = *(char *)((long)plVar24 + 0x2b);
          if (cVar3 == '5') {
            bVar23 = 0;
            iVar15 = 0xd;
LAB_0012c310:
            bVar30 = 0;
          }
          else {
            if (cVar3 != '7') {
              if (cVar3 != '6') goto LAB_0012c41c;
              iVar15 = 0xf;
              bVar23 = 1;
              goto LAB_0012c310;
            }
            iVar15 = 0x10;
            bVar30 = 1;
            bVar23 = 0;
          }
          puVar9[0x55] = 0xffffffe2;
          iVar5 = puVar9[1];
          iVar21 = 1 << (sbyte)iVar15;
          puVar9[1] = iVar21;
          puVar9[2] = iVar21 + -1;
          local_a8 = a;
          local_a0 = plVar24;
          if ((*(void **)(puVar9 + 4) == (void *)0x0) || (iVar5 != iVar21)) {
            free(*(void **)(puVar9 + 4));
            pvVar17 = malloc((long)(int)puVar9[1]);
            *(void **)(puVar9 + 4) = pvVar17;
            if (pvVar17 != (void *)0x0) goto LAB_0012c35e;
          }
          else {
LAB_0012c35e:
            memset(*(void **)(puVar9 + 4),0x20,(long)(int)puVar9[1]);
            puVar9[6] = 0;
            puVar9[9] = 0;
            *puVar9 = 0;
            puVar9[0x4f] = iVar15 + 1;
            puVar9[0x50] = (bVar23 | bVar30) | 4;
            *(undefined8 *)(puVar9 + 0x51) = 0x500000013;
            *(undefined8 *)(puVar9 + 10) = 0;
            puVar9[0xc] = 0;
            wVar14 = lzh_huffman_init((huffman_conflict *)(puVar9 + 0xe),0x1fe,tbl_bits);
            iVar15 = -0x1e;
            if (wVar14 == L'\0') {
              puVar9[0x10] = 9;
              wVar14 = lzh_huffman_init((huffman_conflict *)(puVar9 + 0x2e),0x13,tbl_bits_00);
              plVar24 = local_a0;
              a = local_a8;
              if (wVar14 == L'\0') {
                puVar9[0x55] = 0;
                iVar15 = 0;
              }
              goto LAB_0012c41c;
            }
          }
          iVar15 = -0x1e;
          plVar24 = local_a0;
          a = local_a8;
        }
      }
LAB_0012c41c:
      if (iVar15 != 0) {
        if (iVar15 == -0x19) {
          *local_80 = (void *)0x0;
          *size = 0;
          *offset = 0;
          archive_set_error(&a->archive,0x54,"Unsupported lzh compression method -%c%c%c-",
                            (ulong)(uint)(int)*(char *)((long)plVar24 + 0x29),
                            (ulong)(uint)(int)*(char *)((long)plVar24 + 0x2a),
                            (ulong)(uint)(int)*(char *)((long)plVar24 + 0x2b));
          archive_read_format_lha_read_data_skip(a);
          return L'\xffffffec';
        }
        fmt = "Couldn\'t allocate memory for lzh decompression";
        goto LAB_0012c486;
      }
      *(undefined1 *)((long)plVar24 + 0x123) = 1;
      plVar24[0x33] = 0;
      plVar24[0x34] = 0;
    }
    pvVar17 = __archive_read_ahead(a,1,&local_48);
    plVar24[0x2f] = (long)pvVar17;
    if (0 < local_48) {
      if (plVar24[1] < local_48) {
        local_48 = plVar24[1];
      }
      lVar11 = local_48;
      plVar24[0x30] = local_48;
      plVar24[0x31] = 0;
      if (plVar24[0x33] == 0) {
        *(int *)(plVar24 + 0x32) = (int)plVar24[0x25];
        *(undefined4 *)((long)plVar24 + 0x194) = *(undefined4 *)((long)plVar24 + 300);
        *(int *)(plVar24 + 0x33) = (int)plVar24[0x26];
        *(undefined4 *)((long)plVar24 + 0x19c) = *(undefined4 *)((long)plVar24 + 0x134);
      }
      piVar7 = (int *)plVar24[0x35];
      wVar14 = piVar7[0x55];
      if (wVar14 == L'\0') {
        strm = (lzh_stream *)(plVar24 + 0x2f);
        local_c0 = plVar24[1];
        local_a8 = a;
        local_a0 = plVar24;
        local_40 = offset;
        local_38 = size;
LAB_0012b267:
        ds = (lzh_dec *)local_a0[0x35];
        if (*piVar7 < 9) {
          br = &ds->br;
          hf = &ds->pt;
          local_b0 = (ds->pt).freq;
          phVar31 = &ds->lt;
          local_70 = (ds->lt).freq;
          local_90 = phVar31;
          local_88 = hf;
switchD_0012b2bf_default:
          switch(ds->state) {
          case L'\0':
            if (((ds->br).cache_avail < L'\x10') &&
               (wVar14 = lzh_br_fillup(strm,br), wVar14 == L'\0')) {
              wVar14 = L'\0';
              if (lVar11 != local_c0) goto LAB_0012c053;
              if ((ds->br).cache_avail < L'\b') {
                if ((ds->w_pos < L'\x01') ||
                   (wVar27 = lzh_copy_from_window(strm,ds), wVar14 = L'\0', wVar27 != L'\0')) {
                  wVar14 = L'\x01';
                }
                goto LAB_0012c053;
              }
            }
            else {
              wVar14 = (ds->br).cache_avail + L'\xfffffff0';
              uVar18 = (ds->br).cache_buffer >> ((byte)wVar14 & 0x3f);
              ds->blocks_avail = (uint)uVar18 & 0xffff;
              if ((uVar18 & 0xffff) != 0) {
                (ds->br).cache_avail = wVar14;
                wVar14 = ds->literal_pt_len_bits;
                (ds->pt).len_size = ds->literal_pt_len_size;
                (ds->pt).len_bits = wVar14;
                ds->reading_position = L'\0';
                goto switchD_0012b2bf_caseD_1;
              }
            }
            break;
          case L'\x01':
switchD_0012b2bf_caseD_1:
            if ((((ds->pt).len_bits <= (ds->br).cache_avail) ||
                (wVar14 = lzh_br_fillup(strm,br), wVar14 != L'\0')) ||
               ((ds->pt).len_bits <= (ds->br).cache_avail)) {
              wVar14 = (ds->pt).len_bits;
              wVar27 = (ds->br).cache_avail - wVar14;
              (ds->pt).len_avail =
                   (uint)cache_masks[wVar14] &
                   (uint)((ds->br).cache_buffer >> ((byte)wVar27 & 0x3f));
              (ds->br).cache_avail = wVar27;
              goto switchD_0012b2bf_caseD_2;
            }
            if (lVar11 != local_c0) {
              ds->state = L'\x01';
              goto LAB_0012beb7;
            }
            break;
          case L'\x02':
switchD_0012b2bf_caseD_2:
            wVar14 = (ds->pt).len_avail;
            if (wVar14 != L'\0') {
              wVar19 = hf->len_size;
              if (wVar19 < wVar14) break;
              ds->loop = L'\0';
              local_b0[0x10] = L'\0';
              local_b0[0xc] = L'\0';
              local_b0[0xd] = L'\0';
              local_b0[0xe] = L'\0';
              local_b0[0xf] = L'\0';
              local_b0[8] = L'\0';
              local_b0[9] = L'\0';
              local_b0[10] = L'\0';
              local_b0[0xb] = L'\0';
              local_b0[4] = L'\0';
              local_b0[5] = L'\0';
              local_b0[6] = L'\0';
              local_b0[7] = L'\0';
              local_b0[0] = L'\0';
              local_b0[1] = L'\0';
              local_b0[2] = L'\0';
              local_b0[3] = L'\0';
              wVar27 = L'\x04';
              if ((L'\x02' < wVar14) && (wVar19 != ds->pos_pt_len_size))
              goto switchD_0012b2bf_caseD_3;
              goto LAB_0012b880;
            }
            if ((((ds->br).cache_avail < (ds->pt).len_bits) &&
                (wVar14 = lzh_br_fillup(strm,br), wVar14 == L'\0')) &&
               ((ds->br).cache_avail < (ds->pt).len_bits)) {
              if (lVar11 != local_c0) {
                ds->state = L'\x02';
                goto LAB_0012beb7;
              }
            }
            else {
              wVar14 = (ds->pt).len_bits;
              wVar14 = (uint)((ds->br).cache_buffer >>
                             ((char)(ds->br).cache_avail - (char)wVar14 & 0x3fU)) &
                       (uint)cache_masks[wVar14];
              if (wVar14 < (ds->pt).len_size) {
                *(ds->pt).tbl = (uint16_t)wVar14;
                (ds->pt).max_bits = L'\0';
                (ds->pt).shift_bits = L'\0';
                (ds->pt).bitlen[(uint)wVar14] = '\0';
                pwVar22 = &(ds->br).cache_avail;
                *pwVar22 = *pwVar22 - (ds->pt).len_bits;
                wVar27 = (uint)(ds->reading_position != L'\0') * 4 + L'\x05';
                goto LAB_0012b880;
              }
            }
            break;
          case L'\x03':
switchD_0012b2bf_caseD_3:
            wVar14 = lzh_read_pt_bitlen(strm,ds->loop,L'\x03');
            ds->loop = wVar14;
            if (wVar14 < L'\x03') {
              if ((lVar11 != local_c0) && (L'\xffffffff' < wVar14)) {
LAB_0012bf68:
                ds->state = L'\x03';
                goto LAB_0012beb7;
              }
            }
            else if (((ds->br).cache_avail < L'\x02') &&
                    ((wVar14 = lzh_br_fillup(strm,br), wVar14 == L'\0' &&
                     ((ds->br).cache_avail < L'\x02')))) {
              if (lVar11 != local_c0) goto LAB_0012bf68;
            }
            else {
              wVar14 = (ds->br).cache_avail + L'\xfffffffe';
              uVar18 = (ds->br).cache_buffer >> ((byte)wVar14 & 0x3f);
              uVar20 = (uint)uVar18;
              (ds->br).cache_avail = wVar14;
              if ((int)(uVar20 & 3) <= (ds->pt).len_avail + L'\xfffffffd') {
                if ((uVar18 & 3) == 0) {
                  lVar29 = 3;
                }
                else {
                  lVar29 = 3;
                  do {
                    (ds->pt).bitlen[lVar29] = '\0';
                    lVar2 = lVar29 - (ulong)(uVar20 & 3);
                    lVar29 = lVar29 + 1;
                  } while (lVar2 != 2);
                }
                ds->loop = (wchar_t)lVar29;
                goto switchD_0012b2bf_caseD_4;
              }
            }
            break;
          case L'\x04':
switchD_0012b2bf_caseD_4:
            wVar14 = lzh_read_pt_bitlen(strm,ds->loop,(ds->pt).len_avail);
            ds->loop = wVar14;
            if (wVar14 < (ds->pt).len_avail) {
              if ((lVar11 != local_c0) && (L'\xffffffff' < wVar14)) {
                ds->state = L'\x04';
                goto LAB_0012beb7;
              }
            }
            else {
              wVar14 = lzh_make_huffman_table(hf);
              if (wVar14 != L'\0') {
                wVar27 = L'\t';
                if (ds->reading_position != L'\0') goto LAB_0012b880;
                goto switchD_0012b2bf_caseD_5;
              }
            }
            break;
          case L'\x05':
switchD_0012b2bf_caseD_5:
            if ((((ds->lt).len_bits <= (ds->br).cache_avail) ||
                (wVar14 = lzh_br_fillup(strm,br), wVar14 != L'\0')) ||
               ((ds->lt).len_bits <= (ds->br).cache_avail)) {
              wVar14 = (ds->lt).len_bits;
              wVar27 = (ds->br).cache_avail - wVar14;
              (ds->lt).len_avail =
                   (uint)cache_masks[wVar14] &
                   (uint)((ds->br).cache_buffer >> ((byte)wVar27 & 0x3f));
              (ds->br).cache_avail = wVar27;
              goto switchD_0012b2bf_caseD_6;
            }
            if (lVar11 != local_c0) {
              ds->state = L'\x05';
              goto LAB_0012beb7;
            }
            break;
          case L'\x06':
switchD_0012b2bf_caseD_6:
            wVar14 = (ds->lt).len_avail;
            if (wVar14 == L'\0') {
              if ((((ds->br).cache_avail < (ds->lt).len_bits) &&
                  (wVar14 = lzh_br_fillup(strm,br), wVar14 == L'\0')) &&
                 ((ds->br).cache_avail < (ds->lt).len_bits)) {
                if (lVar11 != local_c0) {
                  ds->state = L'\x06';
                  goto LAB_0012beb7;
                }
              }
              else {
                wVar14 = (ds->lt).len_bits;
                wVar14 = (uint)((ds->br).cache_buffer >>
                               ((char)(ds->br).cache_avail - (char)wVar14 & 0x3fU)) &
                         (uint)cache_masks[wVar14];
                if (wVar14 < (ds->lt).len_size) {
                  *(ds->lt).tbl = (uint16_t)wVar14;
                  (ds->lt).max_bits = L'\0';
                  (ds->lt).shift_bits = L'\0';
                  (ds->lt).bitlen[(uint)wVar14] = '\0';
                  pwVar22 = &(ds->br).cache_avail;
                  *pwVar22 = *pwVar22 - (ds->lt).len_bits;
                  wVar27 = L'\b';
                  goto LAB_0012b880;
                }
              }
            }
            else if (wVar14 <= phVar31->len_size) {
              ds->loop = L'\0';
              local_70[0x10] = L'\0';
              local_70[0xc] = L'\0';
              local_70[0xd] = L'\0';
              local_70[0xe] = L'\0';
              local_70[0xf] = L'\0';
              local_70[8] = L'\0';
              local_70[9] = L'\0';
              local_70[10] = L'\0';
              local_70[0xb] = L'\0';
              local_70[4] = L'\0';
              local_70[5] = L'\0';
              local_70[6] = L'\0';
              local_70[7] = L'\0';
              local_70[0] = L'\0';
              local_70[1] = L'\0';
              local_70[2] = L'\0';
              local_70[3] = L'\0';
              goto switchD_0012b2bf_caseD_7;
            }
            break;
          case L'\a':
switchD_0012b2bf_caseD_7:
            wVar27 = ds->loop;
            wVar14 = (ds->lt).len_avail;
            while (hf = local_88, phVar31 = local_90, wVar27 < wVar14) {
              if ((((ds->br).cache_avail < (ds->pt).max_bits) &&
                  (wVar14 = lzh_br_fillup(strm,br), wVar14 == L'\0')) &&
                 ((ds->br).cache_avail < (ds->pt).max_bits)) {
                if (lVar11 == local_c0) goto LAB_0012c03f;
                ds->loop = wVar27;
                ds->state = L'\a';
                goto LAB_0012beb7;
              }
              wVar14 = (ds->br).cache_avail;
              wVar19 = (ds->pt).max_bits;
              uVar20 = (uint)cache_masks[wVar19] &
                       (uint)((ds->br).cache_buffer >> ((char)wVar14 - (char)wVar19 & 0x3fU));
              wVar19 = (ds->pt).shift_bits;
              uVar4 = (ds->pt).tbl[uVar20 >> ((byte)wVar19 & 0x1f)];
              wVar25 = (wchar_t)uVar4;
              wVar28 = (ds->pt).len_avail;
              if ((int)(uint)uVar4 < wVar28) {
                wVar16 = (uint)uVar4;
              }
              else {
                phVar8 = (ds->pt).tree;
                do {
                  wVar16 = L'\0';
                  if ((wVar19 < L'\x01') || (wVar25 = wVar25 - wVar28, (ds->pt).tree_used <= wVar25)
                     ) break;
                  wVar19 = wVar19 + L'\xffffffff';
                  phVar26 = (htree_t *)&phVar8[wVar25].right;
                  if ((uVar20 >> (wVar19 & 0x1fU) & 1) != 0) {
                    phVar26 = phVar8 + wVar25;
                  }
                  wVar25 = (wchar_t)phVar26->left;
                  wVar16 = wVar25;
                } while (wVar28 <= wVar25);
              }
              if ((uint)wVar16 < 3) {
                if (wVar16 == L'\0') {
                  (ds->br).cache_avail = wVar14 - (uint)*(ds->pt).bitlen;
                  uVar18 = 0;
                  goto LAB_0012b7aa;
                }
                uVar20 = (uint)(wVar16 != L'\x01') * 5 + 4;
                if (((wVar14 < (uint)(wVar16 != L'\x01') * 5 + (uint)(ds->pt).bitlen[(uint)wVar16] +
                               L'\x04') && (wVar14 = lzh_br_fillup(strm,br), wVar14 == L'\0')) &&
                   ((ds->br).cache_avail < (int)((ds->pt).bitlen[(uint)wVar16] + uVar20))) {
                  iVar15 = 5;
                  if (lVar11 != local_c0) {
                    ds->loop = wVar27;
                    ds->state = L'\a';
                    iVar15 = 1;
                  }
                }
                else {
                  wVar14 = ((ds->br).cache_avail - (uint)(ds->pt).bitlen[(uint)wVar16]) - uVar20;
                  uVar13 = (uint)cache_masks[uVar20] &
                           (uint)((ds->br).cache_buffer >> ((byte)wVar14 & 0x3f));
                  (ds->br).cache_avail = wVar14;
                  uVar20 = uVar13 + 3;
                  if (wVar16 != L'\x01') {
                    uVar20 = uVar13 + 0x14;
                  }
                  iVar15 = 5;
                  if (uVar20 + wVar27 <= (ds->lt).len_avail) {
                    iVar15 = 0;
                    memset((ds->lt).bitlen + wVar27,0,(ulong)uVar20);
                    wVar27 = uVar20 + wVar27;
                  }
                }
                if (iVar15 != 0) {
                  if (iVar15 == 5) goto LAB_0012c03f;
                  goto LAB_0012beb7;
                }
              }
              else {
                (ds->br).cache_avail = wVar14 - (uint)(ds->pt).bitlen[(uint)wVar16];
                uVar18 = (ulong)(uint)(wVar16 + L'\xfffffffe');
                pwVar22 = (ds->lt).freq + uVar18;
                *pwVar22 = *pwVar22 + L'\x01';
LAB_0012b7aa:
                lVar29 = (long)wVar27;
                wVar27 = wVar27 + L'\x01';
                (ds->lt).bitlen[lVar29] = (uchar)uVar18;
              }
              wVar14 = (ds->lt).len_avail;
            }
            if ((wVar27 <= wVar14) && (wVar14 = lzh_make_huffman_table(local_90), wVar14 != L'\0'))
            goto switchD_0012b2bf_caseD_8;
            break;
          case L'\b':
switchD_0012b2bf_caseD_8:
            wVar14 = ds->pos_pt_len_bits;
            (ds->pt).len_size = ds->pos_pt_len_size;
            (ds->pt).len_bits = wVar14;
            ds->reading_position = L'\x01';
            wVar27 = L'\x01';
LAB_0012b880:
            ds->state = wVar27;
            goto switchD_0012b2bf_default;
          case L'\t':
            goto switchD_0012b2bf_caseD_9;
          default:
            goto switchD_0012b2bf_default;
          }
LAB_0012c03f:
          ds->error = L'\xffffffe7';
          wVar14 = L'\xffffffe7';
          goto LAB_0012c053;
        }
        local_60 = &ds->br;
        local_d8.cache_buffer = (ds->br).cache_buffer;
        local_d8.cache_avail = (ds->br).cache_avail;
        local_d8._12_4_ = *(undefined4 *)&(ds->br).field_0xc;
        local_70 = (wchar_t *)ds->w_buff;
        local_58 = (ds->lt).bitlen;
        local_68 = (ds->pt).bitlen;
        local_b4 = ds->blocks_avail;
        wVar27 = ds->copy_len;
        wVar19 = ds->copy_pos;
        wVar28 = ds->w_pos;
        local_90 = (huffman_conflict *)CONCAT44(local_90._4_4_,ds->w_mask);
        wVar25 = ds->state;
        pwVar22 = (wchar_t *)(ulong)(uint)wVar25;
        local_88 = (huffman_conflict *)CONCAT44(local_88._4_4_,ds->w_size);
        local_50 = (long)(ds->lt).max_bits;
        lVar29 = (long)(ds->pt).max_bits;
        lVar2 = lVar29;
        if ((ds->w_remaining < L'\x01') ||
           (wVar14 = lzh_copy_from_window(strm,ds), wVar16 = local_b4, wVar14 != L'\0')) {
switchD_0012b955_default:
          do {
            local_78 = lVar2;
            lVar2 = local_78;
            switch((int)pwVar22) {
            case 9:
              wVar16 = local_b4;
              local_b0 = pwVar22;
LAB_0012b960:
              lVar29 = local_50;
              if (wVar16 == L'\0') {
                ds->state = L'\0';
                *(undefined4 *)&local_60->cache_buffer = (undefined4)local_d8.cache_buffer;
                *(undefined4 *)((long)&local_60->cache_buffer + 4) = local_d8.cache_buffer._4_4_;
                local_60->cache_avail = local_d8.cache_avail;
                *(undefined4 *)&local_60->field_0xc = local_d8._12_4_;
                ds->blocks_avail = L'\0';
                ds->w_pos = wVar28;
                ds->copy_pos = L'\0';
                goto switchD_0012b2bf_caseD_9;
              }
              wVar14 = (wchar_t)local_50;
              if (((local_d8.cache_avail < wVar14) &&
                  (wVar27 = lzh_br_fillup(strm,&local_d8), wVar27 == L'\0')) &&
                 (local_d8.cache_avail < wVar14)) {
                if (lVar11 != local_c0) goto LAB_0012bf46;
                uVar20 = (uint)cache_masks[local_50] &
                         (uint)(local_d8.cache_buffer <<
                               ((char)local_50 - (char)local_d8.cache_avail & 0x3fU));
                wVar14 = (ds->lt).shift_bits;
                wVar27 = (ds->lt).len_avail;
                uVar4 = (ds->lt).tbl[uVar20 >> ((byte)wVar14 & 0x1f)];
                wVar19 = (wchar_t)uVar4;
                if ((int)(uint)uVar4 < wVar27) {
                  uVar18 = (ulong)uVar4;
                }
                else {
                  phVar8 = (ds->lt).tree;
                  do {
                    uVar18 = 0;
                    if ((wVar14 < L'\x01') ||
                       (wVar19 = wVar19 - wVar27, (ds->lt).tree_used <= wVar19)) break;
                    wVar14 = wVar14 + L'\xffffffff';
                    phVar26 = (htree_t *)&phVar8[wVar19].right;
                    if ((uVar20 >> (wVar14 & 0x1fU) & 1) != 0) {
                      phVar26 = phVar8 + wVar19;
                    }
                    wVar19 = (wchar_t)phVar26->left;
                    uVar18 = (ulong)(uint)wVar19;
                  } while (wVar27 <= wVar19);
                }
                uVar20 = (uint)uVar18;
                local_d8.cache_avail = local_d8.cache_avail - (uint)local_58[uVar18];
                if (L'\xffffffff' < local_d8.cache_avail) goto LAB_0012ba94;
                goto LAB_0012bf7d;
              }
              uVar20 = (uint)cache_masks[lVar29] &
                       (uint)(local_d8.cache_buffer >>
                             ((char)local_d8.cache_avail - (char)lVar29 & 0x3fU));
              wVar14 = (ds->lt).shift_bits;
              wVar27 = (ds->lt).len_avail;
              uVar4 = (ds->lt).tbl[uVar20 >> ((byte)wVar14 & 0x1f)];
              wVar19 = (wchar_t)uVar4;
              if ((int)(uint)uVar4 < wVar27) {
                uVar18 = (ulong)uVar4;
              }
              else {
                phVar8 = (ds->lt).tree;
                do {
                  uVar18 = 0;
                  if ((wVar14 < L'\x01') || (wVar19 = wVar19 - wVar27, (ds->lt).tree_used <= wVar19)
                     ) break;
                  wVar14 = wVar14 + L'\xffffffff';
                  phVar26 = (htree_t *)&phVar8[wVar19].right;
                  if ((uVar20 >> (wVar14 & 0x1fU) & 1) != 0) {
                    phVar26 = phVar8 + wVar19;
                  }
                  wVar19 = (wchar_t)phVar26->left;
                  uVar18 = (ulong)(uint)wVar19;
                } while (wVar27 <= wVar19);
              }
              uVar20 = (uint)uVar18;
              local_d8.cache_avail = local_d8.cache_avail - (uint)local_58[uVar18];
LAB_0012ba94:
              wVar16 = wVar16 + L'\xffffffff';
              if (uVar20 < 0x100) goto code_r0x0012baa6;
              wVar27 = uVar20 + L'\xffffff03';
              lVar29 = local_78;
              local_b4 = wVar16;
              break;
            case 10:
              local_b0 = pwVar22;
              break;
            case 0xb:
              local_b0 = pwVar22;
              goto LAB_0012bc6c;
            case 0xc:
              goto switchD_0012b955_caseD_c;
            default:
              goto switchD_0012b955_default;
            }
            if (((local_d8.cache_avail < (wchar_t)lVar29) &&
                (wVar14 = lzh_br_fillup(strm,&local_d8), wVar14 == L'\0')) &&
               (local_d8.cache_avail < (wchar_t)lVar29)) {
              if (lVar11 != local_c0) {
                ds->copy_len = wVar27;
                wVar25 = L'\n';
                wVar16 = local_b4;
                goto LAB_0012be9a;
              }
              uVar20 = (uint)cache_masks[lVar29] &
                       (uint)(local_d8.cache_buffer <<
                             ((char)lVar29 - (char)local_d8.cache_avail & 0x3fU));
              wVar14 = (ds->pt).shift_bits;
              wVar19 = (ds->pt).len_avail;
              uVar4 = (ds->pt).tbl[uVar20 >> ((byte)wVar14 & 0x1f)];
              wVar25 = (wchar_t)uVar4;
              if ((int)(uint)uVar4 < wVar19) {
                uVar18 = (ulong)uVar4;
              }
              else {
                phVar8 = (ds->pt).tree;
                do {
                  uVar18 = 0;
                  if ((wVar14 < L'\x01') || (wVar25 = wVar25 - wVar19, (ds->pt).tree_used <= wVar25)
                     ) break;
                  wVar14 = wVar14 + L'\xffffffff';
                  phVar26 = (htree_t *)&phVar8[wVar25].right;
                  if ((uVar20 >> (wVar14 & 0x1fU) & 1) != 0) {
                    phVar26 = phVar8 + wVar25;
                  }
                  wVar25 = (wchar_t)phVar26->left;
                  uVar18 = (ulong)(uint)wVar25;
                } while (wVar19 <= wVar25);
              }
              wVar19 = (wchar_t)uVar18;
              local_d8.cache_avail = local_d8.cache_avail - (uint)local_68[uVar18];
              if (L'\xffffffff' < local_d8.cache_avail) goto LAB_0012bc6c;
LAB_0012bf7d:
              ds->error = L'\xffffffe7';
              wVar14 = L'\xffffffe7';
              break;
            }
            uVar20 = (uint)cache_masks[lVar29] &
                     (uint)(local_d8.cache_buffer >>
                           ((char)local_d8.cache_avail - (char)lVar29 & 0x3fU));
            wVar14 = (ds->pt).shift_bits;
            wVar19 = (ds->pt).len_avail;
            uVar4 = (ds->pt).tbl[uVar20 >> ((byte)wVar14 & 0x1f)];
            wVar25 = (wchar_t)uVar4;
            if ((int)(uint)uVar4 < wVar19) {
              uVar18 = (ulong)uVar4;
            }
            else {
              phVar8 = (ds->pt).tree;
              do {
                uVar18 = 0;
                if ((wVar14 < L'\x01') || (wVar25 = wVar25 - wVar19, (ds->pt).tree_used <= wVar25))
                break;
                wVar14 = wVar14 + L'\xffffffff';
                phVar26 = (htree_t *)&phVar8[wVar25].right;
                if ((uVar20 >> (wVar14 & 0x1fU) & 1) != 0) {
                  phVar26 = phVar8 + wVar25;
                }
                wVar25 = (wchar_t)phVar26->left;
                uVar18 = (ulong)(uint)wVar25;
              } while (wVar19 <= wVar25);
            }
            wVar19 = (wchar_t)uVar18;
            local_d8.cache_avail = local_d8.cache_avail - (uint)local_68[uVar18];
LAB_0012bc6c:
            pwVar22 = local_b0;
            if (L'\x01' < wVar19) {
              wVar14 = wVar19 + L'\xffffffff';
              if (((local_d8.cache_avail < wVar14) &&
                  (wVar25 = lzh_br_fillup(strm,&local_d8), wVar25 == L'\0')) &&
                 (local_d8.cache_avail < wVar14)) {
                iVar15 = 4;
                pwVar22 = local_b0;
                if (lVar11 != local_c0) {
                  ds->copy_len = wVar27;
                  ds->copy_pos = wVar19;
                  iVar15 = 1;
                  pwVar22 = (wchar_t *)0xb;
                }
              }
              else {
                local_d8.cache_avail = local_d8.cache_avail - wVar14;
                wVar19 = ((uint)cache_masks[(uint)wVar14] &
                         (uint)(local_d8.cache_buffer >> ((byte)local_d8.cache_avail & 0x3f))) +
                         (1 << ((byte)wVar14 & 0x1f));
                iVar15 = 0;
                pwVar22 = local_b0;
              }
              if (iVar15 != 0) {
                wVar25 = (wchar_t)pwVar22;
                wVar16 = local_b4;
                if (iVar15 != 1) goto LAB_0012bf7d;
                goto LAB_0012be9a;
              }
            }
            wVar19 = ~wVar19 + wVar28 & (uint)local_90;
switchD_0012b955_caseD_c:
            local_94 = (wchar_t)pwVar22;
            do {
              wVar25 = wVar28;
              if (wVar28 < wVar19) {
                wVar25 = wVar19;
              }
              wVar25 = (wchar_t)local_88 - wVar25;
              wVar14 = wVar25;
              if (wVar27 < wVar25) {
                wVar14 = wVar27;
              }
              local_b0 = (wchar_t *)CONCAT44(local_b0._4_4_,wVar14 + wVar19);
              if ((wVar14 + wVar19 < wVar28) || (wVar14 + wVar28 < wVar19)) {
                memcpy((void *)((long)local_70 + (long)wVar28),
                       (void *)((long)wVar19 + (long)local_70),(long)wVar14);
              }
              else if (L'\0' < wVar14) {
                uVar18 = 0;
                do {
                  *(undefined1 *)((long)local_70 + (long)wVar28 + uVar18) =
                       *(undefined1 *)((long)wVar19 + (long)local_70 + uVar18);
                  uVar18 = uVar18 + 1;
                } while ((uint)wVar14 != uVar18);
              }
              wVar28 = wVar14 + wVar28 & (uint)local_90;
              if (wVar28 == L'\0') {
                ds->w_remaining = (wchar_t)local_88;
                wVar16 = lzh_copy_from_window(strm,ds);
                if (wVar16 != L'\0') goto LAB_0012bdb9;
                pwVar22 = (wchar_t *)0x2;
                local_94 = L'\t';
                if (wVar25 < wVar27) {
                  ds->copy_len = wVar27 - wVar14;
                  ds->copy_pos = (uint)local_b0 & (uint)local_90;
                  local_94 = L'\f';
                }
              }
              else {
LAB_0012bdb9:
                pwVar22 = (wchar_t *)0x9;
                if (wVar25 < wVar27) {
                  wVar27 = wVar27 - wVar14;
                  wVar19 = (uint)local_b0 & (uint)local_90;
                  pwVar22 = (wchar_t *)0x0;
                }
              }
              iVar15 = (int)pwVar22;
            } while (iVar15 == 0);
            wVar25 = local_94;
            wVar16 = local_b4;
            if (iVar15 == 2) goto LAB_0012be9a;
            lVar29 = local_78;
            lVar2 = local_78;
          } while (iVar15 == 9);
        }
        else {
LAB_0012be9a:
          *(undefined4 *)&local_60->cache_buffer = (undefined4)local_d8.cache_buffer;
          *(undefined4 *)((long)&local_60->cache_buffer + 4) = local_d8.cache_buffer._4_4_;
          local_60->cache_avail = local_d8.cache_avail;
          *(undefined4 *)&local_60->field_0xc = local_d8._12_4_;
          ds->blocks_avail = wVar16;
          ds->state = wVar25;
          ds->w_pos = wVar28;
LAB_0012beb7:
          wVar14 = L'\0';
        }
        goto LAB_0012c053;
      }
LAB_0012c204:
      if (wVar14 != L'\0') {
        if (wVar14 != L'\x01') {
          archive_set_error(&a->archive,-1,"Bad lzh data");
          return L'\xffffffe7';
        }
        *(undefined1 *)((long)plVar24 + 0x124) = 1;
      }
      plVar24[2] = plVar24[0x31];
      plVar24[1] = plVar24[1] - plVar24[0x31];
      if ((plVar24[0x33] != 0) && (*(char *)((long)plVar24 + 0x124) == '\0')) {
        *offset = *plVar24;
        *size = 0;
        *local_80 = (void *)0x0;
        return L'\0';
      }
      *offset = *plVar24;
      pvVar17 = (void *)plVar24[0x25];
      len = plVar24[0x32] - (long)pvVar17;
      *size = len;
      *local_80 = pvVar17;
      uVar12 = lha_crc16(*(uint16_t *)(plVar24 + 3),pvVar17,len);
      *(uint16_t *)(plVar24 + 3) = uVar12;
      *plVar24 = *plVar24 + len;
      return L'\0';
    }
    fmt = "Truncated LHa file body";
  }
  iVar15 = 0x54;
LAB_0012c48e:
  archive_set_error(&a->archive,iVar15,fmt);
  return L'\xffffffe2';
switchD_0012b2bf_caseD_9:
  wVar14 = L'd';
LAB_0012c053:
  if (wVar14 != L'd') goto LAB_0012c1dc;
  goto LAB_0012b267;
code_r0x0012baa6:
  *(char *)((long)local_70 + (long)wVar28) = (char)uVar20;
  wVar28 = wVar28 + L'\x01';
  if ((wchar_t)local_88 <= wVar28) {
    ds->w_remaining = (wchar_t)local_88;
    wVar14 = lzh_copy_from_window(strm,ds);
    wVar28 = L'\0';
    if (wVar14 == L'\0') {
LAB_0012bf46:
      wVar25 = (wchar_t)local_b0;
      goto LAB_0012be9a;
    }
  }
  goto LAB_0012b960;
LAB_0012c1dc:
  local_a0[0x31] = local_a0[0x31] + (lVar11 - local_a0[0x30]);
  plVar24 = local_a0;
  offset = local_40;
  a = local_a8;
  size = local_38;
  goto LAB_0012c204;
}

Assistant:

static int
archive_read_format_lha_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	struct lha *lha = (struct lha *)(a->format->data);
	int r;

	if (lha->entry_unconsumed) {
		/* Consume as much as the decompressor actually used. */
		__archive_read_consume(a, lha->entry_unconsumed);
		lha->entry_unconsumed = 0;
	}
	if (lha->end_of_entry) {
		if (!lha->end_of_entry_cleanup) {
			if ((lha->setflag & CRC_IS_SET) &&
			    lha->crc != lha->entry_crc_calculated) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "LHa data CRC error");
				return (ARCHIVE_WARN);
			}

			/* End-of-entry cleanup done. */
			lha->end_of_entry_cleanup = 1;
		}
		*offset = lha->entry_offset;
		*size = 0;
		*buff = NULL;
		return (ARCHIVE_EOF);
	}

	if (lha->entry_is_compressed)
		r =  lha_read_data_lzh(a, buff, size, offset);
	else
		/* No compression. */
		r =  lha_read_data_none(a, buff, size, offset);
	return (r);
}